

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  uint64_t uVar1;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_50;
  MemoryModuleField *local_48;
  Location local_40;
  
  GetLocation(&local_40,this);
  MakeUnique<wabt::MemoryModuleField,wabt::Location>((wabt *)&local_48,&local_40);
  *(undefined4 *)((long)&(local_48->memory).page_limits.max + 7) =
       *(undefined4 *)((long)&page_limits->max + 7);
  uVar1 = page_limits->max;
  (local_48->memory).page_limits.initial = page_limits->initial;
  (local_48->memory).page_limits.max = uVar1;
  local_50._M_head_impl = local_48;
  local_48 = (MemoryModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_50);
  if (local_50._M_head_impl != (MemoryModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_50._M_head_impl = (MemoryModuleField *)0x0;
  if (local_48 != (MemoryModuleField *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = MakeUnique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}